

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::ParseBase62Number
          (RustSymbolParser *this,int *value)

{
  char *pcVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  bool bVar8;
  
  *value = -1;
  pcVar1 = this->encoding_;
  if (pcVar1[this->pos_] == '_') {
    this->pos_ = this->pos_ + 1;
    iVar7 = 0;
LAB_0039418d:
    *value = iVar7;
    return true;
  }
  iVar3 = this->pos_;
  bVar6 = pcVar1[iVar3];
  iVar4 = 0;
  if (((byte)(bVar6 - 0x30) < 10) || ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a)) {
    pbVar2 = (byte *)(pcVar1 + (long)iVar3 + 1);
    iVar5 = 0;
    do {
      iVar3 = iVar3 + 1;
      this->pos_ = iVar3;
      if (iVar4 < 0x2108421) {
        bVar6 = pbVar2[-1];
        if ((byte)(bVar6 - 0x30) < 10) {
          iVar7 = bVar6 - 0x30;
        }
        else if ((byte)(bVar6 + 0x9f) < 0x1a) {
          iVar7 = bVar6 - 0x57;
        }
        else {
          iVar7 = (char)bVar6 + -0x1d;
        }
        iVar4 = iVar4 * 0x3e + iVar7;
      }
      else {
        iVar5 = 1;
      }
      bVar6 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (((byte)(bVar6 - 0x30) < 10) || ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a));
    iVar7 = iVar4 + 1;
  }
  else {
    iVar7 = 1;
    iVar5 = iVar4;
  }
  bVar8 = bVar6 == 0x5f;
  if (bVar8) {
    this->pos_ = iVar3 + 1;
    bVar8 = true;
    if (iVar5 == 0) goto LAB_0039418d;
  }
  return bVar8;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseBase62Number(int& value) {
    value = -1;

    // base-62-number = (digit | lower | upper)* _
    //
    // An empty base-62 digit sequence means 0.
    if (Eat('_')) {
      value = 0;
      return true;
    }

    // A nonempty digit sequence denotes its base-62 value plus 1.
    int encoded_number = 0;
    bool overflowed = false;
    while (IsAlpha(Peek()) || IsDigit(Peek())) {
      const char c = Take();
      if (encoded_number >= std::numeric_limits<int>::max()/62) {
        // If we are close to overflowing an int, keep parsing but stop updating
        // encoded_number and remember to return -1 at the end.  The point is to
        // avoid undefined behavior while parsing crate-root disambiguators,
        // which are large in practice but not shown in demangling, while
        // successfully computing closure and shim disambiguators, which are
        // typically small and are printed out.
        overflowed = true;
      } else {
        int digit;
        if (IsDigit(c)) {
          digit = c - '0';
        } else if (IsLower(c)) {
          digit = c - 'a' + 10;
        } else {
          digit = c - 'A' + 36;
        }
        encoded_number = 62 * encoded_number + digit;
      }
    }

    if (!Eat('_')) return false;
    if (!overflowed) value = encoded_number + 1;
    return true;
  }